

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void print_option_string(nh_option_desc *option,char *buf)

{
  size_t sVar1;
  char *__s;
  char *pcVar2;
  char fmt [16];
  char acStack_38 [24];
  
  pcVar2 = "submenu";
  if ((1 < option->type - OPTTYPE_AUTOPICKUP_RULES) && (option->type != 1000)) {
    pcVar2 = (char *)nh_get_option_string(option);
  }
  if (settings.optstyle == 1) {
    sprintf(acStack_38,"%%.%ds\t[%%s]",(ulong)(_COLS - 0x15));
    __s = option->name;
  }
  else {
    if (settings.optstyle != 0) {
      sprintf(acStack_38,"%%s\t[%%s]\t%%.%ds",(ulong)(_COLS - 0x2a));
      snprintf(buf,0x100,acStack_38,option->name,pcVar2,option->helptxt);
      return;
    }
    __s = option->helptxt;
    if ((__s == (char *)0x0) || (sVar1 = strlen(__s), sVar1 < 2)) {
      __s = option->name;
    }
    sprintf(acStack_38,"%%.%ds\t[%%s]",(ulong)(_COLS - 0x15));
  }
  snprintf(buf,0x100,acStack_38,__s,pcVar2);
  return;
}

Assistant:

static void print_option_string(struct nh_option_desc *option, char *buf)
{
    char fmt[16];
    const char *opttxt;
    const char *valstr = get_display_string(option);
    
    switch (settings.optstyle) {
	case OPTSTYLE_DESC:
	    opttxt = option->helptxt;
	    if (!opttxt || strlen(opttxt) < 2)
		opttxt = option->name;
	    
	    sprintf(fmt, "%%.%ds\t[%%s]", COLS - 21);
	    snprintf(buf, BUFSZ, fmt, opttxt, valstr);
	    break;
	    
	case OPTSTYLE_NAME:
	    sprintf(fmt, "%%.%ds\t[%%s]", COLS - 21);
	    snprintf(buf, BUFSZ, fmt, option->name, valstr);
	    break;
	    
	default:
	case OPTSTYLE_FULL:
	    sprintf(fmt, "%%s\t[%%s]\t%%.%ds", COLS - 42);
	    snprintf(buf, BUFSZ, fmt, option->name, valstr, option->helptxt);
	    break;
    }
}